

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIFactoredRewardDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
TOIFactoredRewardDecPOMDPDiscrete::GetReward(TOIFactoredRewardDecPOMDPDiscrete *this)

{
  Index in_stack_00000088;
  Index in_stack_0000008c;
  TOIFactoredRewardDecPOMDPDiscrete *in_stack_00000090;
  
  GetReward(in_stack_00000090,in_stack_0000008c,in_stack_00000088);
  return;
}

Assistant:

double TOIFactoredRewardDecPOMDPDiscrete::GetReward(Index sI, Index jaI) const
{
    double reward=0;
    vector<Index> indSIs=JointToIndividualStateIndices(sI),
        indAIs=JointToIndividualActionIndices(jaI);

    for(unsigned int i=0;i!=GetNrAgents();++i)
        reward+=GetIndividualReward(indSIs[i],indAIs[i],i);

    reward+=_m_p_rModel->Get(indSIs,indAIs);
//    reward+=_m_p_rModel->Get(sI,jaI);

#if DEBUG_TOIFactoredRewardDecPOMDPDiscrete
    cout << "GetReward(" << sI << "," << jaI << ") = " << reward << endl;
#endif
    return(reward);
}